

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

unqlite_col * unqliteVmFetchCollection(unqlite_vm *pVm,SyString *pName)

{
  sxu32 nLen;
  char *pSrc;
  unqlite_col *puVar1;
  sxu32 sVar2;
  int iVar3;
  unqlite_col **ppuVar4;
  
  if (pVm->iCol != 0) {
    pSrc = pName->zString;
    nLen = pName->nByte;
    sVar2 = SyBinHash(pSrc,nLen);
    ppuVar4 = pVm->apCol + (pVm->iColSize - 1 & sVar2);
    while (puVar1 = *ppuVar4, puVar1 != (unqlite_col *)0x0) {
      if (sVar2 == puVar1->nHash) {
        iVar3 = nLen - (puVar1->sName).nByte;
        if (iVar3 == 0) {
          iVar3 = SyMemcmp(pSrc,(puVar1->sName).zString,nLen);
        }
        if (iVar3 == 0) {
          return puVar1;
        }
      }
      ppuVar4 = &puVar1->pNextCol;
    }
  }
  return (unqlite_col *)0x0;
}

Assistant:

static unqlite_col * unqliteVmFetchCollection(
	unqlite_vm *pVm, /* Target VM */
	SyString *pName  /* Lookup name */
	)
{
	unqlite_col *pCol;
	sxu32 nHash;
	if( pVm->iCol < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	nHash = SyBinHash((const void *)pName->zString,pName->nByte);
	/* Perform the lookup */
	pCol = pVm->apCol[nHash & ( pVm->iColSize - 1)];
	for(;;){
		if( pCol == 0 ){
			break;
		}
		if( nHash == pCol->nHash && SyStringCmp(pName,&pCol->sName,SyMemcmp) == 0 ){
			/* Collection found */
			return pCol;
		}
		/* Point to the next entry */
		pCol = pCol->pNextCol;
	}
	/* No such collection */
	return 0;
}